

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall crnlib::mip_level::convert(mip_level *this,conversion_type conv_type)

{
  component_flags cVar1;
  pixel_format pVar2;
  pixel_format pVar3;
  bool bVar4;
  
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    unpack_from_dxt(this,false);
  }
  image_utils::convert_image(this->m_pImage,conv_type);
  cVar1 = this->m_pImage->m_comp_flags;
  this->m_comp_flags = cVar1;
  bVar4 = (cVar1 & cCompFlagAValid) == 0;
  pVar2 = PIXEL_FMT_A8R8G8B8;
  if (bVar4) {
    pVar2 = PIXEL_FMT_R8G8B8;
  }
  pVar3 = PIXEL_FMT_A8L8;
  if (bVar4) {
    pVar3 = PIXEL_FMT_L8;
  }
  if ((cVar1 & cCompFlagGrayscale) == 0) {
    pVar3 = pVar2;
  }
  this->m_format = pVar3;
  return true;
}

Assistant:

bool mip_level::convert(image_utils::conversion_type conv_type) {
  if (m_pDXTImage)
    unpack_from_dxt(true);

  image_utils::convert_image(*m_pImage, conv_type);

  m_comp_flags = m_pImage->get_comp_flags();

  if (m_pImage->is_grayscale())
    m_format = m_pImage->has_alpha() ? PIXEL_FMT_A8L8 : PIXEL_FMT_L8;
  else
    m_format = m_pImage->has_alpha() ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;

  return true;
}